

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

short __thiscall
duckdb::Interpolator<true>::Operation<short,short,duckdb::QuantileDirect<short>>
          (Interpolator<true> *this,short *v_t,Vector *result,QuantileDirect<short> *accessor)

{
  RESULT_TYPE_conflict RVar1;
  short sVar2;
  short *in_RCX;
  short *in_stack_00000028;
  Interpolator<true> *in_stack_00000030;
  undefined6 in_stack_ffffffffffffffd8;
  
  RVar1 = InterpolateInternal<short,duckdb::QuantileDirect<short>>
                    (in_stack_00000030,in_stack_00000028,(QuantileDirect<short> *)this);
  sVar2 = CastInterpolation::Cast<short,short>
                    (in_RCX,(Vector *)CONCAT26(RVar1,in_stack_ffffffffffffffd8));
  return sVar2;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(InterpolateInternal(v_t, accessor), result);
	}